

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rambunctious-recitation.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  char cVar2;
  value_type vVar3;
  value_type vVar4;
  void *pvVar5;
  int *piVar6;
  ostream *poVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  long lVar11;
  size_type __pos;
  vector<int,_std::allocator<int>_> numbers;
  string input;
  ifstream file;
  int local_2cc;
  vector<int,_std::allocator<int>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  char *local_270;
  vector<int,_std::allocator<int>_> local_268;
  vector<int,_std::allocator<int>_> local_250;
  long local_238 [4];
  int aiStack_218 [122];
  
  if (argc != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Provide input file\n",0x13);
    return 0;
  }
  std::ifstream::ifstream(local_238,argv[1],_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    iVar10 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open file\n",0x14);
    goto LAB_0010284c;
  }
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  local_290._M_string_length = 0;
  local_290.field_2._M_local_buf[0] = '\0';
  cVar2 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_290,cVar2);
  _Var1._M_p = local_290._M_dataplus._M_p;
  local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  if (local_290._M_string_length == 0) {
LAB_00102620:
    __pos = 0;
  }
  else {
    pvVar5 = memchr(local_290._M_dataplus._M_p,0x2c,local_290._M_string_length);
    lVar11 = (long)pvVar5 - (long)_Var1._M_p;
    if (lVar11 == -1 || pvVar5 == (void *)0x0) goto LAB_00102620;
    __pos = 0;
    do {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_2b0,&local_290,__pos,lVar11 - __pos);
      _Var1._M_p = local_2b0._M_dataplus._M_p;
      piVar6 = __errno_location();
      iVar10 = *piVar6;
      *piVar6 = 0;
      lVar8 = strtol(_Var1._M_p,&local_270,10);
      if (local_270 == _Var1._M_p) {
        std::__throw_invalid_argument("stoi");
LAB_00102986:
        std::__throw_out_of_range("stoi");
        goto LAB_00102992;
      }
      if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar6 == 0x22)) goto LAB_00102986;
      if (*piVar6 == 0) {
        *piVar6 = iVar10;
      }
      local_2cc = (int)lVar8;
      if (local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_2c8,
                   (iterator)
                   local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_2cc);
      }
      else {
        *local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_2cc;
        local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      _Var1._M_p = local_290._M_dataplus._M_p;
      __pos = lVar11 + 1;
    } while (((__pos <= local_290._M_string_length && local_290._M_string_length - __pos != 0) &&
             (pvVar5 = memchr(local_290._M_dataplus._M_p + __pos,0x2c,
                              local_290._M_string_length - __pos), pvVar5 != (void *)0x0)) &&
            (lVar11 = (long)pvVar5 - (long)_Var1._M_p, lVar11 != -1));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_2b0,&local_290,__pos,0xffffffffffffffff);
  _Var1._M_p = local_2b0._M_dataplus._M_p;
  piVar6 = __errno_location();
  iVar10 = *piVar6;
  *piVar6 = 0;
  lVar11 = strtol(_Var1._M_p,&local_270,10);
  if (local_270 == _Var1._M_p) {
LAB_00102992:
    std::__throw_invalid_argument("stoi");
  }
  else if ((0xfffffffeffffffff < lVar11 - 0x80000000U) && (*piVar6 != 0x22)) {
    if (*piVar6 == 0) {
      *piVar6 = iVar10;
    }
    local_2cc = (int)lVar11;
    if (local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_2c8,
                 (iterator)
                 local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_2cc);
    }
    else {
      *local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_2cc;
      local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    std::vector<int,_std::allocator<int>_>::vector(&local_250,&local_2c8);
    vVar3 = game(0x7e4,&local_250);
    if (local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::vector<int,_std::allocator<int>_>::vector(&local_268,&local_2c8);
    vVar4 = game(30000000,&local_268);
    if (local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_268.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 2: ",8);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,vVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,vVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    if (local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                               local_290.field_2._M_local_buf[0]) + 1);
    }
    iVar10 = 0;
LAB_0010284c:
    std::ifstream::~ifstream(local_238);
    return iVar10;
  }
  uVar9 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar9);
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Provide input file\n";
    return 0;
  }

  auto file = std::ifstream (argv[1]);

  if (!file.good()) {
    std::cerr << "Could not open file\n";
    return 1;
  }

  std::string input;
  std::getline(file, input);

  std::vector<int> numbers;

  size_t pos = 0;
  for(auto to = input.find(','); to != std::string::npos; to = input.find(',', pos)) {
    numbers.push_back(std::stoi(input.substr(pos, to - pos)));
    pos = to + 1;
  }
  numbers.push_back(std::stoi(input.substr(pos)));

  auto a1 = game(2020, numbers);
  std::cout << "Part 1: " << a1 << "\n";

  auto a2 = game(30000000, numbers);
  std::cout << "Part 2: " << a2 << "\n";

  std::cout << a1 << "\n" << a2 << "\n";
}